

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall mjs::object::property::put(property *this,object *self,value *val)

{
  gc_heap *heap;
  bool bVar1;
  gc_heap_ptr_untyped *pgVar2;
  undefined8 *puVar3;
  wstring_view __x;
  initializer_list<mjs::value> __l;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y;
  allocator_type local_109;
  object_ptr a;
  undefined1 local_f8 [24];
  wchar_t *local_e0;
  value s;
  vector<mjs::value,_std::allocator<mjs::value>_> local_98;
  undefined1 local_80 [40];
  value local_58;
  
  bVar1 = has_attributes(this->attributes_,read_only);
  if (bVar1) {
    __assert_fail("!has_attributes(attributes_, property_attribute::read_only)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                  ,0xf4,"void mjs::object::property::put(const object &, const value &)");
  }
  bVar1 = is_accessor(this);
  if (bVar1) {
    heap = self->heap_;
    value_representation::get_value(&s,&this->value_,heap);
    pgVar2 = &value::object_value(&s)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&a.super_gc_heap_ptr_untyped,pgVar2);
    value::~value(&s);
    puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(&a.super_gc_heap_ptr_untyped);
    local_f8._16_8_ = (slot *)0x3;
    local_e0 = L"set";
    (**(code **)*puVar3)(&s,puVar3);
    puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(&a.super_gc_heap_ptr_untyped);
    local_80._0_8_ = 10;
    local_80._8_8_ = L"__strict__";
    (**(code **)*puVar3)(local_f8 + 0x10,puVar3);
    bVar1 = value::boolean_value((value *)(local_f8 + 0x10));
    if (bVar1) {
      bVar1 = is_primitive_object(self);
    }
    else {
      bVar1 = false;
    }
    value::~value((value *)(local_f8 + 0x10));
    if (bVar1 == false) {
      gc_heap::unsafe_track<mjs::object>((gc_heap *)local_f8,(object *)heap);
      value::value((value *)(local_f8 + 0x10),(object_ptr *)local_f8);
    }
    else {
      (*self->_vptr_object[4])(local_f8 + 0x10,self);
    }
    value::value((value *)local_80,val);
    __l._M_len = 1;
    __l._M_array = (iterator)local_80;
    std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_98,__l,&local_109);
    call_function(&local_58,&s,(value *)(local_f8 + 0x10),&local_98);
    value::~value(&local_58);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_98);
    value::~value((value *)local_80);
    value::~value((value *)(local_f8 + 0x10));
    if (bVar1 == false) {
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
    }
    value::~value(&s);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&a.super_gc_heap_ptr_untyped);
  }
  else {
    if (val->type_ == object) {
      pgVar2 = &value::object_value(val)->super_gc_heap_ptr_untyped;
      gc_heap_ptr_untyped::get(pgVar2);
      class_name((object *)&s);
      __x = string::view((string *)&s);
      __y._M_str = L"Accessor";
      __y._M_len = 8;
      bVar1 = std::operator!=(__x,__y);
      if (!bVar1) {
        __assert_fail("val.type() != value_type::object || val.object_value()->class_name().view() != L\"Accessor\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                      ,0xfc,"void mjs::object::property::put(const object &, const value &)");
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&s);
    }
    raw_put(this,val);
  }
  return;
}

Assistant:

void object::property::put(const object& self, const value& val) {
    assert(!has_attributes(attributes_, property_attribute::read_only));
    if (is_accessor()) {
        auto& h = self.heap();
        auto a = value_.get_value(h).object_value();
        auto s = a->get(L"set");
        const bool strict = a->get(L"__strict__").boolean_value() && is_primitive_object(self);
        call_function(s, strict ? self.internal_value() : value{h.unsafe_track(self)}, {val});
    } else {
        assert(val.type() != value_type::object || val.object_value()->class_name().view() != L"Accessor");
        raw_put(val);
    }
}